

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O0

void __thiscall M2TSStreamInfo::M2TSStreamInfo(M2TSStreamInfo *this,PMTStreamInfo *pmtStreamInfo)

{
  uint8_t uVar1;
  uint uVar2;
  int iVar3;
  VideoAspectRatio ar_00;
  double fps;
  long *local_b8;
  H264StreamReader *local_a0;
  MPEGStreamReader *local_70;
  int freq;
  SimplePacketizerReader *aStream;
  H264StreamReader *h264Stream;
  VideoAspectRatio ar;
  MPEGStreamReader *vStream;
  PMTStreamInfo *pmtStreamInfo_local;
  M2TSStreamInfo *this_local;
  
  std::
  vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
  ::vector(&this->m_index);
  this->streamPID = pmtStreamInfo->m_pid;
  this->stream_coding_type = pmtStreamInfo->m_streamType;
  std::
  vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
  ::operator=(&this->m_index,&pmtStreamInfo->m_index);
  this->isSecondary = (bool)(pmtStreamInfo->isSecondary & 1);
  memset(this->language_code,0,4);
  *(undefined2 *)this->language_code = *(undefined2 *)pmtStreamInfo->m_lang;
  this->language_code[2] = pmtStreamInfo->m_lang[2];
  this->character_code = '\0';
  this->video_format = '\0';
  this->frame_rate_index = '\0';
  this->number_of_offset_sequences = 0;
  this->audio_presentation_type = '\0';
  this->sampling_frequency_index = '\0';
  this->aspect_ratio_index = '\x03';
  if (pmtStreamInfo->m_codecReader != (AbstractStreamReader *)0x0) {
    if (pmtStreamInfo->m_codecReader == (AbstractStreamReader *)0x0) {
      local_70 = (MPEGStreamReader *)0x0;
    }
    else {
      local_70 = (MPEGStreamReader *)
                 __dynamic_cast(pmtStreamInfo->m_codecReader,&AbstractStreamReader::typeinfo,
                                &MPEGStreamReader::typeinfo,0);
    }
    if (local_70 != (MPEGStreamReader *)0x0) {
      uVar2 = (*(local_70->super_AbstractStreamReader).super_BaseAbstractStreamReader.
                _vptr_BaseAbstractStreamReader[0x14])();
      this->width = uVar2;
      uVar2 = (*(local_70->super_AbstractStreamReader).super_BaseAbstractStreamReader.
                _vptr_BaseAbstractStreamReader[0x15])();
      this->height = uVar2;
      iVar3 = (*(local_70->super_AbstractStreamReader).super_BaseAbstractStreamReader.
                _vptr_BaseAbstractStreamReader[9])();
      this->HDR = iVar3;
      ar_00 = MPEGStreamReader::getStreamAR(local_70);
      fps = MPEGStreamReader::getFPS(local_70);
      iVar3 = (*(local_70->super_AbstractStreamReader).super_BaseAbstractStreamReader.
                _vptr_BaseAbstractStreamReader[0x16])();
      blurayStreamParams(fps,(bool)((byte)iVar3 & 1),this->width,this->height,ar_00,
                         &this->video_format,&this->frame_rate_index,&this->aspect_ratio_index);
      if (ar_00 == AR_3_4) {
        this->width = (this->height << 2) / 3;
      }
      else if (ar_00 == AR_16_9) {
        this->width = (this->height << 4) / 9;
      }
      else if (ar_00 == AR_221_100) {
        this->width = (this->height * 0xdd) / 100;
      }
    }
    if (pmtStreamInfo->m_codecReader == (AbstractStreamReader *)0x0) {
      local_a0 = (H264StreamReader *)0x0;
    }
    else {
      local_a0 = (H264StreamReader *)
                 __dynamic_cast(pmtStreamInfo->m_codecReader,&AbstractStreamReader::typeinfo,
                                &H264StreamReader::typeinfo,0);
    }
    if (local_a0 != (H264StreamReader *)0x0) {
      iVar3 = H264StreamReader::getOffsetSeqCnt(local_a0);
      this->number_of_offset_sequences = iVar3;
    }
    if (pmtStreamInfo->m_codecReader == (AbstractStreamReader *)0x0) {
      local_b8 = (long *)0x0;
    }
    else {
      local_b8 = (long *)__dynamic_cast(pmtStreamInfo->m_codecReader,&AbstractStreamReader::typeinfo
                                        ,&SimplePacketizerReader::typeinfo,0);
    }
    if (local_b8 != (long *)0x0) {
      uVar1 = (**(code **)(*local_b8 + 0xb8))();
      this->audio_presentation_type = uVar1;
      if (this->audio_presentation_type == '\x02') {
        this->audio_presentation_type = '\x03';
      }
      else if (3 < this->audio_presentation_type) {
        this->audio_presentation_type = '\x06';
      }
      iVar3 = (**(code **)(*local_b8 + 0xa8))();
      if (iVar3 == 48000) {
        iVar3 = (**(code **)(*local_b8 + 0xb0))();
        if (iVar3 == 96000) {
          this->sampling_frequency_index = '\x0e';
        }
        else {
          iVar3 = (**(code **)(*local_b8 + 0xb0))();
          if (iVar3 == 0x2ee00) {
            this->sampling_frequency_index = '\f';
          }
          else {
            this->sampling_frequency_index = '\x01';
          }
        }
      }
      else if (iVar3 == 96000) {
        iVar3 = (**(code **)(*local_b8 + 0xb0))();
        if (iVar3 == 0x2ee00) {
          this->sampling_frequency_index = '\f';
        }
        else {
          this->sampling_frequency_index = '\x04';
        }
      }
      else if (iVar3 == 0x2ee00) {
        this->sampling_frequency_index = '\x05';
      }
    }
  }
  return;
}

Assistant:

M2TSStreamInfo::M2TSStreamInfo(const PMTStreamInfo& pmtStreamInfo)
{
    streamPID = pmtStreamInfo.m_pid;
    stream_coding_type = pmtStreamInfo.m_streamType;
    m_index = pmtStreamInfo.m_index;
    isSecondary = pmtStreamInfo.isSecondary;
    memset(&language_code, 0, 4);
    memcpy(language_code, pmtStreamInfo.m_lang, 3);

    character_code = 0;
    video_format = 0;
    frame_rate_index = 0;
    number_of_offset_sequences = 0;
    audio_presentation_type = 0;
    sampling_frequency_index = 0;
    aspect_ratio_index = 3;  // 16:9; 2 = 4:3

    if (pmtStreamInfo.m_codecReader != nullptr)
    {
        const auto vStream = dynamic_cast<MPEGStreamReader*>(pmtStreamInfo.m_codecReader);
        if (vStream)
        {
            width = vStream->getStreamWidth();
            height = vStream->getStreamHeight();
            HDR = vStream->getStreamHDR();
            const VideoAspectRatio ar = vStream->getStreamAR();
            blurayStreamParams(vStream->getFPS(), vStream->getInterlaced(), width, height, ar, &video_format,
                               &frame_rate_index, &aspect_ratio_index);
            if (ar == VideoAspectRatio::AR_3_4)
                width = height * 4 / 3;
            else if (ar == VideoAspectRatio::AR_16_9)
                width = height * 16 / 9;
            else if (ar == VideoAspectRatio::AR_221_100)
                width = height * 221 / 100;
        }
        const auto h264Stream = dynamic_cast<H264StreamReader*>(pmtStreamInfo.m_codecReader);
        if (h264Stream)
            number_of_offset_sequences = h264Stream->getOffsetSeqCnt();

        const auto aStream = dynamic_cast<SimplePacketizerReader*>(pmtStreamInfo.m_codecReader);
        if (aStream)
        {
            audio_presentation_type = aStream->getChannels();
            if (audio_presentation_type == 2)
                audio_presentation_type = 3;
            else if (audio_presentation_type > 3)
                audio_presentation_type = 6;
            const int freq = aStream->getFreq();
            switch (freq)
            {
            case 48000:
                if (aStream->getAltFreq() == 96000)
                    sampling_frequency_index = 14;
                else if (aStream->getAltFreq() == 192000)
                    sampling_frequency_index = 12;
                else
                    sampling_frequency_index = 1;
                break;
            case 96000:
                if (aStream->getAltFreq() == 192000)
                    sampling_frequency_index = 12;
                else
                    sampling_frequency_index = 4;
                break;
            case 192000:
                sampling_frequency_index = 5;
                break;
            default:;
            }
        }
    }
}